

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-perf-events.h
# Opt level: O0

void __thiscall
LinuxEvents<0>::LinuxEvents(LinuxEvents<0> *this,vector<int,_std::allocator<int>_> *config_vec)

{
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  long lVar4;
  reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RSI;
  uint *in_RDI;
  int config;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  uint32_t i;
  int group;
  unsigned_long flags;
  int cpu;
  int pid;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  uint *__new_size;
  allocator local_69;
  string local_68 [36];
  int local_44;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38 [2];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  LinuxEvents<0> *this_00;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x187364);
  __new_size = in_RDI + 0x2a;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x18737a);
  memset(in_RDI + 2,0,0x80);
  in_RDI[2] = 0;
  in_RDI[3] = 0x80;
  *(ulong *)(in_RDI + 0xc) = *(ulong *)(in_RDI + 0xc) & 0xfffffffffffffffe | 1;
  *(ulong *)(in_RDI + 0xc) = *(ulong *)(in_RDI + 0xc) & 0xffffffffffffffdf | 0x20;
  *(ulong *)(in_RDI + 0xc) = *(ulong *)(in_RDI + 0xc) & 0xffffffffffffffbf | 0x40;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[10] = 0xc;
  in_RDI[0xb] = 0;
  this_00 = (LinuxEvents<0> *)0x0;
  uVar8 = 0xffffffff;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  in_RDI[0x22] = (uint)sVar2;
  uVar6 = 0;
  local_38[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  local_40 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff48);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (local_38);
    local_44 = *piVar3;
    *(long *)(in_RDI + 4) = (long)local_44;
    lVar4 = syscall(0x12a,in_RDI + 2,0,0xffffffff,(ulong)uVar8,0);
    *in_RDI = (uint)lVar4;
    uVar7 = uVar6;
    if (*in_RDI == 0xffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"perf_event_open",&local_69);
      report_error(this_00,(string *)CONCAT44(uVar8,uVar6));
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      uVar7 = uVar6;
    }
    in_stack_ffffffffffffff54 = *in_RDI;
    uVar6 = uVar7 + 1;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x2a),
                        (ulong)uVar7);
    ioctl(in_stack_ffffffffffffff54,0x80082407,pvVar5);
    if (uVar8 == 0xffffffff) {
      uVar8 = *in_RDI;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_38);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,(size_type)__new_size);
  return;
}

Assistant:

explicit LinuxEvents(std::vector<int> config_vec) : fd(0), working(true) {
    memset(&attribs, 0, sizeof(attribs));
    attribs.type = TYPE;
    attribs.size = sizeof(attribs);
    attribs.disabled = 1;
    attribs.exclude_kernel = 1;
    attribs.exclude_hv = 1;

    attribs.sample_period = 0;
    attribs.read_format = PERF_FORMAT_GROUP | PERF_FORMAT_ID;
    const int pid = 0;  // the current process
    const int cpu = -1; // all CPUs
    const unsigned long flags = 0;

    int group = -1; // no group
    num_events = config_vec.size();
    uint32_t i = 0;
    for (auto config : config_vec) {
      attribs.config = config;
      fd = syscall(__NR_perf_event_open, &attribs, pid, cpu, group, flags);
      if (fd == -1) {
        report_error("perf_event_open");
      }
      ioctl(fd, PERF_EVENT_IOC_ID, &ids[i++]);
      if (group == -1) {
        group = fd;
      }
    }

    temp_result_vec.resize(num_events * 2 + 1);
  }